

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_show_frame_flag(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *local_40;
  FrameWorkerData *frame_worker_data;
  int *arg;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 1;
  }
  if ((undefined4 *)*local_40 == (undefined4 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    *(undefined4 *)*local_40 = *(undefined4 *)(*ctx->frame_worker->data1 + 0x3d40);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_show_frame_flag(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  *arg = frame_worker_data->pbi->common.show_frame;
  return AOM_CODEC_OK;
}